

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O1

UChar32 ucnv_getNextUChar_63(UConverter *cnv,char **source,char *sourceLimit,UErrorCode *err)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  UConverterGetNextUChar p_Var4;
  char cVar5;
  UChar32 UVar6;
  int iVar7;
  int32_t delta;
  int iVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  UChar buffer [2];
  UConverterToUnicodeArgs args;
  UChar local_74 [2];
  int local_70;
  int local_6c;
  UConverterToUnicodeArgs local_68;
  
  if (err == (UErrorCode *)0x0) {
    return 0xffff;
  }
  if (U_ZERO_ERROR < *err) {
    return 0xffff;
  }
  if (((cnv == (UConverter *)0x0 || source == (char **)0x0) ||
      (pcVar3 = *source, sourceLimit < pcVar3)) ||
     ((ulong)((long)sourceLimit - (long)pcVar3) >> 0x1f != 0 &&
      (pcVar3 <= sourceLimit && (long)sourceLimit - (long)pcVar3 != 0))) {
    *err = U_ILLEGAL_ARGUMENT_ERROR;
    return 0xffff;
  }
  cVar1 = cnv->UCharErrorBufferLength;
  iVar7 = (int)cVar1;
  if (iVar7 < 1) {
    uVar10 = 0xffffffff;
  }
  else {
    uVar10 = (uint)(ushort)cnv->UCharErrorBuffer[0];
    lVar9 = 1;
    if ((cVar1 != '\x01' && (uVar10 & 0xfc00) == 0xd800) &&
       (((ushort)cnv->UCharErrorBuffer[1] & 0xfc00) == 0xdc00)) {
      uVar10 = uVar10 * 0x400 + (uint)(ushort)cnv->UCharErrorBuffer[1] + 0xfca02400;
      lVar9 = 2;
    }
    cVar5 = cVar1 - (char)lVar9;
    cnv->UCharErrorBufferLength = cVar5;
    iVar8 = (int)lVar9;
    if (cVar5 != '\0' && (char)lVar9 <= cVar1) {
      local_70 = (int)lVar9;
      local_6c = iVar7;
      memmove(cnv->UCharErrorBuffer,cnv->UCharErrorBuffer + lVar9,(ulong)(byte)(cVar5 * '\x02'));
      iVar8 = local_70;
      iVar7 = local_6c;
    }
    if (iVar8 < iVar7) {
      return uVar10;
    }
    if ((uVar10 & 0xfffffc00) != 0xd800) {
      return uVar10;
    }
  }
  local_68.flush = '\x01';
  local_68.offsets = (int32_t *)0x0;
  local_68.target = local_74;
  local_68.targetLimit = local_74 + 1;
  local_68.size = 0x38;
  local_68.converter = cnv;
  local_68.source = pcVar3;
  local_68.sourceLimit = sourceLimit;
  if ((int)uVar10 < 0) {
    if ((cnv->toULength == '\0') &&
       (p_Var4 = cnv->sharedData->impl->getNextUChar, p_Var4 != (UConverterGetNextUChar)0x0)) {
      UVar6 = (*p_Var4)(&local_68,err);
      *source = local_68.source;
      if (*err == U_INDEX_OUTOFBOUNDS_ERROR) {
        _reset(cnv,UCNV_RESET_TO_UNICODE,'\0');
        return 0xffff;
      }
      if (-1 < UVar6 && *err < U_ILLEGAL_ARGUMENT_ERROR) {
        return UVar6;
      }
    }
    _toUnicodeWithCallback(&local_68,err);
    if (*err == U_BUFFER_OVERFLOW_ERROR) {
      *err = U_ZERO_ERROR;
    }
    iVar7 = (int)((ulong)((long)local_68.target - (long)local_74) >> 1);
  }
  else {
    local_74[0] = (UChar)uVar10;
    iVar7 = 1;
    local_68.target = local_68.targetLimit;
  }
  uVar11 = 0xffff;
  uVar10 = 0;
  if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
    if (iVar7 == 0) {
      *err = U_INDEX_OUTOFBOUNDS_ERROR;
      uVar10 = 0;
      iVar7 = 0;
    }
    else {
      uVar11 = (uint)(ushort)local_74[0];
      uVar10 = 1;
      if ((uVar11 & 0xfc00) == 0xd800) {
        cVar1 = cnv->UCharErrorBufferLength;
        if ((long)cVar1 < 1) {
          if (sourceLimit <= local_68.source) goto LAB_0030b6fc;
          local_68.targetLimit = (UChar *)&local_70;
          _toUnicodeWithCallback(&local_68,err);
          if (*err == U_BUFFER_OVERFLOW_ERROR) {
            *err = U_ZERO_ERROR;
          }
          iVar7 = (int)((ulong)((long)local_68.target - (long)local_74) >> 1);
          if ((*err < U_ILLEGAL_ARGUMENT_ERROR) && (iVar7 == 2)) {
            iVar7 = 2;
            if (((ushort)local_74[1] & 0xfc00) == 0xdc00) {
              uVar11 = uVar11 * 0x400 + (uint)(ushort)local_74[1] + 0xfca02400;
              uVar10 = 2;
              iVar7 = 2;
              goto LAB_0030b6fc;
            }
          }
        }
        else {
          if (((ushort)cnv->UCharErrorBuffer[0] & 0xfc00) != 0xdc00) goto LAB_0030b6fc;
          uVar11 = uVar11 * 0x400 + (uint)(ushort)cnv->UCharErrorBuffer[0] + 0xfca02400;
          lVar9 = (long)cVar1 + -1;
          cnv->UCharErrorBufferLength = (int8_t)lVar9;
          if (cVar1 == '\x01') goto LAB_0030b6fc;
          memmove(cnv->UCharErrorBuffer,cnv->UCharErrorBuffer + 1,(ulong)(uint)((int)lVar9 * 2));
        }
        uVar10 = 1;
      }
    }
  }
LAB_0030b6fc:
  iVar8 = iVar7 - uVar10;
  if (iVar8 != 0 && (int)uVar10 <= iVar7) {
    bVar2 = cnv->UCharErrorBufferLength;
    if ('\0' < (char)bVar2) {
      memmove(cnv->UCharErrorBuffer + iVar8,cnv->UCharErrorBuffer,(ulong)((uint)bVar2 * 2));
    }
    cnv->UCharErrorBufferLength = bVar2 + (char)iVar8;
    cnv->UCharErrorBuffer[0] = local_74[uVar10];
    if (1 < iVar8) {
      cnv->UCharErrorBuffer[1] = local_74[(ulong)uVar10 + 1];
    }
  }
  *source = local_68.source;
  return uVar11;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
ucnv_getNextUChar(UConverter *cnv,
                  const char **source, const char *sourceLimit,
                  UErrorCode *err) {
    UConverterToUnicodeArgs args;
    UChar buffer[U16_MAX_LENGTH];
    const char *s;
    UChar32 c;
    int32_t i, length;

    /* check parameters */
    if(err==NULL || U_FAILURE(*err)) {
        return 0xffff;
    }

    if(cnv==NULL || source==NULL) {
        *err=U_ILLEGAL_ARGUMENT_ERROR;
        return 0xffff;
    }

    s=*source;
    if(sourceLimit<s) {
        *err=U_ILLEGAL_ARGUMENT_ERROR;
        return 0xffff;
    }

    /*
     * Make sure that the buffer sizes do not exceed the number range for
     * int32_t because some functions use the size (in units or bytes)
     * rather than comparing pointers, and because offsets are int32_t values.
     *
     * size_t is guaranteed to be unsigned and large enough for the job.
     *
     * Return with an error instead of adjusting the limits because we would
     * not be able to maintain the semantics that either the source must be
     * consumed or the target filled (unless an error occurs).
     * An adjustment would be sourceLimit=t+0x7fffffff; for example.
     */
    if(((size_t)(sourceLimit-s)>(size_t)0x7fffffff && sourceLimit>s)) {
        *err=U_ILLEGAL_ARGUMENT_ERROR;
        return 0xffff;
    }

    c=U_SENTINEL;

    /* flush the target overflow buffer */
    if(cnv->UCharErrorBufferLength>0) {
        UChar *overflow;

        overflow=cnv->UCharErrorBuffer;
        i=0;
        length=cnv->UCharErrorBufferLength;
        U16_NEXT(overflow, i, length, c);

        /* move the remaining overflow contents up to the beginning */
        if((cnv->UCharErrorBufferLength=(int8_t)(length-i))>0) {
            uprv_memmove(cnv->UCharErrorBuffer, cnv->UCharErrorBuffer+i,
                         cnv->UCharErrorBufferLength*U_SIZEOF_UCHAR);
        }

        if(!U16_IS_LEAD(c) || i<length) {
            return c;
        }
        /*
         * Continue if the overflow buffer contained only a lead surrogate,
         * in case the converter outputs single surrogates from complete
         * input sequences.
         */
    }

    /*
     * flush==TRUE is implied for ucnv_getNextUChar()
     *
     * do not simply return even if s==sourceLimit because the converter may
     * not have seen flush==TRUE before
     */

    /* prepare the converter arguments */
    args.converter=cnv;
    args.flush=TRUE;
    args.offsets=NULL;
    args.source=s;
    args.sourceLimit=sourceLimit;
    args.target=buffer;
    args.targetLimit=buffer+1;
    args.size=sizeof(args);

    if(c<0) {
        /*
         * call the native getNextUChar() implementation if we are
         * at a character boundary (toULength==0)
         *
         * unlike with _toUnicode(), getNextUChar() implementations must set
         * U_TRUNCATED_CHAR_FOUND for truncated input,
         * in addition to setting toULength/toUBytes[]
         */
        if(cnv->toULength==0 && cnv->sharedData->impl->getNextUChar!=NULL) {
            c=cnv->sharedData->impl->getNextUChar(&args, err);
            *source=s=args.source;
            if(*err==U_INDEX_OUTOFBOUNDS_ERROR) {
                /* reset the converter without calling the callback function */
                _reset(cnv, UCNV_RESET_TO_UNICODE, FALSE);
                return 0xffff; /* no output */
            } else if(U_SUCCESS(*err) && c>=0) {
                return c;
            /*
             * else fall through to use _toUnicode() because
             *   UCNV_GET_NEXT_UCHAR_USE_TO_U: the native function did not want to handle it after all
             *   U_FAILURE: call _toUnicode() for callback handling (do not output c)
             */
            }
        }

        /* convert to one UChar in buffer[0], or handle getNextUChar() errors */
        _toUnicodeWithCallback(&args, err);

        if(*err==U_BUFFER_OVERFLOW_ERROR) {
            *err=U_ZERO_ERROR;
        }

        i=0;
        length=(int32_t)(args.target-buffer);
    } else {
        /* write the lead surrogate from the overflow buffer */
        buffer[0]=(UChar)c;
        args.target=buffer+1;
        i=0;
        length=1;
    }

    /* buffer contents starts at i and ends before length */

    if(U_FAILURE(*err)) {
        c=0xffff; /* no output */
    } else if(length==0) {
        /* no input or only state changes */
        *err=U_INDEX_OUTOFBOUNDS_ERROR;
        /* no need to reset explicitly because _toUnicodeWithCallback() did it */
        c=0xffff; /* no output */
    } else {
        c=buffer[0];
        i=1;
        if(!U16_IS_LEAD(c)) {
            /* consume c=buffer[0], done */
        } else {
            /* got a lead surrogate, see if a trail surrogate follows */
            UChar c2;

            if(cnv->UCharErrorBufferLength>0) {
                /* got overflow output from the conversion */
                if(U16_IS_TRAIL(c2=cnv->UCharErrorBuffer[0])) {
                    /* got a trail surrogate, too */
                    c=U16_GET_SUPPLEMENTARY(c, c2);

                    /* move the remaining overflow contents up to the beginning */
                    if((--cnv->UCharErrorBufferLength)>0) {
                        uprv_memmove(cnv->UCharErrorBuffer, cnv->UCharErrorBuffer+1,
                                     cnv->UCharErrorBufferLength*U_SIZEOF_UCHAR);
                    }
                } else {
                    /* c is an unpaired lead surrogate, just return it */
                }
            } else if(args.source<sourceLimit) {
                /* convert once more, to buffer[1] */
                args.targetLimit=buffer+2;
                _toUnicodeWithCallback(&args, err);
                if(*err==U_BUFFER_OVERFLOW_ERROR) {
                    *err=U_ZERO_ERROR;
                }

                length=(int32_t)(args.target-buffer);
                if(U_SUCCESS(*err) && length==2 && U16_IS_TRAIL(c2=buffer[1])) {
                    /* got a trail surrogate, too */
                    c=U16_GET_SUPPLEMENTARY(c, c2);
                    i=2;
                }
            }
        }
    }

    /*
     * move leftover output from buffer[i..length[
     * into the beginning of the overflow buffer
     */
    if(i<length) {
        /* move further overflow back */
        int32_t delta=length-i;
        if((length=cnv->UCharErrorBufferLength)>0) {
            uprv_memmove(cnv->UCharErrorBuffer+delta, cnv->UCharErrorBuffer,
                         length*U_SIZEOF_UCHAR);
        }
        cnv->UCharErrorBufferLength=(int8_t)(length+delta);

        cnv->UCharErrorBuffer[0]=buffer[i++];
        if(delta>1) {
            cnv->UCharErrorBuffer[1]=buffer[i];
        }
    }

    *source=args.source;
    return c;
}